

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)12>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  
  if (0 < count) {
    pbVar3 = src + (long)index * 3 + 2;
    lVar4 = 0;
    do {
      bVar2 = *pbVar3;
      uVar8 = pbVar3[-2] >> 2 & 0x1f;
      uVar7 = ((uint)pbVar3[-2] << 0x10 | (uint)pbVar3[-1] << 8) >> 0xd & 0x1f;
      uVar6 = pbVar3[-1] & 0x1f;
      uVar8 = (uVar8 >> 2) + uVar8 * 8;
      if (bVar2 < uVar8) {
        uVar8 = (uint)bVar2;
      }
      uVar7 = (uVar7 >> 2) + uVar7 * 8;
      uVar5 = (uint)bVar2;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      uVar6 = (uVar6 >> 2) + uVar6 * 8;
      if (uVar5 < uVar6) {
        uVar6 = uVar5;
      }
      fVar9 = (float)bVar2 * 0.003921569;
      pfVar1 = (float *)((long)&buffer->r + lVar4);
      *pfVar1 = (float)uVar8 * 0.003921569 * fVar9;
      pfVar1[1] = (float)uVar7 * 0.003921569 * fVar9;
      pfVar1[2] = (float)uVar6 * 0.003921569 * fVar9;
      pfVar1[3] = fVar9;
      pbVar3 = pbVar3 + 3;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}